

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkVertexInputAttributeDescription * __thiscall
Fossilize::StateRecorder::Impl::copy<VkVertexInputAttributeDescription>
          (Impl *this,VkVertexInputAttributeDescription *src,size_t count,ScratchAllocator *alloc)

{
  VkVertexInputAttributeDescription *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkVertexInputAttributeDescription *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkVertexInputAttributeDescription>
                                   (alloc,count);
    if (this_local != (Impl *)0x0) {
      std::copy<VkVertexInputAttributeDescription_const*,VkVertexInputAttributeDescription*>
                (src,src + count,(VkVertexInputAttributeDescription *)this_local);
    }
  }
  return (VkVertexInputAttributeDescription *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}